

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Order.cpp
# Opt level: O1

void __thiscall Order::show(Order *this)

{
  long *plVar1;
  ostream *poVar2;
  char local_1a;
  char local_19;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Order seqId = ",0xe);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->m_seqId);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Order ActionType = ",0x13);
  local_1a = this->m_actionType;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_1a,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OrderId = ",10);
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OrderSide = ",0xc);
  local_19 = this->m_orderSide;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_19,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OrderQty = ",0xb);
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OrderPrice = ",0xd);
  poVar2 = std::ostream::_M_insert<double>(this->m_orderPrice);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Order::show() const
{
	std::cout << "Order seqId = " << m_seqId << std::endl;
	std::cout << "Order ActionType = " << m_actionType << std::endl;
	std::cout << "OrderId = " << m_orderId << std::endl;
	std::cout << "OrderSide = " << m_orderSide << std::endl;
	std::cout << "OrderQty = " << m_orderQty << std::endl;
	std::cout << "OrderPrice = " << m_orderPrice << std::endl;
}